

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::Reporter::
fatal_usage<char_const(&)[32],std::__cxx11::string_const&,std::__cxx11::string_const&,char_const*>
          (Reporter *this,char (*args) [32],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,char **args_3)

{
  format_string<const_std::__cxx11::basic_string<char>_&,_const_std::__cxx11::basic_string<char>_&,_const_char_*>
  fmt;
  size_t sVar1;
  char **args_2_00;
  undefined8 uVar2;
  char *in_RCX;
  size_t in_RDX;
  ostream *in_R8;
  ReturnCode in_stack_fffffffffffffeec;
  FatalError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  ostream *in_stack_ffffffffffffff20;
  basic_string_view<char> in_stack_ffffffffffffff28;
  char *args_1_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  
  this_00 = (FatalError *)&stack0xffffffffffffff50;
  args_1_00 = "{} fatal: ";
  sVar1 = std::char_traits<char>::length((char_type *)0x27b16a);
  *(size_t *)&this_00->returnCode = sVar1;
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff20,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff18);
  args_2_00 = (char **)std::char_traits<char>::length((char_type *)0x27b208);
  fmt.str_.size_ = in_RDX;
  fmt.str_.data_ = in_RCX;
  ::fmt::v10::print<std::__cxx11::string_const&,std::__cxx11::string_const&,char_const*>
            (in_R8,fmt,in_stack_ffffffffffffff58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1_00,
             args_2_00);
  std::char_traits<char>::length((char_type *)0x27b2ae);
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff20,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff18);
  uVar2 = __cxa_allocate_exception(0x10);
  FatalError::FatalError(this_00,in_stack_fffffffffffffeec);
  __cxa_throw(uVar2,&FatalError::typeinfo,FatalError::~FatalError);
}

Assistant:

void fatal_usage(Args&&... args) {
        fmt::print(std::cerr, "{} fatal: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, " See '{} --help'.\n", commandName);
        throw FatalError(rc::INVALID_ARGUMENTS);
    }